

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

void websocket_write_impl
               (intptr_t fd,void *data,size_t len,char text,char first,char last,char client)

{
  fio_write_args_s options;
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  uint7 uStack_37;
  
  if (0x3000 < len) {
    do {
      websocket_write_impl(fd,data,0x3000,text,first,'\0',client);
      data = (void *)((long)data + 0x3000);
      len = len - 0x3000;
      first = '\0';
    } while (0x3000 < len);
    last = '\x01';
  }
  pbVar2 = (byte *)fio_malloc(len + 0x10);
  bVar11 = (text == '\0') + 1;
  bVar5 = (byte)(len >> 8);
  bVar6 = (byte)len;
  if (client == '\0') {
    if (first == '\0') {
      bVar11 = 0;
    }
    *pbVar2 = last << 7 | bVar11;
    if (len < 0x7e) {
      lVar10 = 2;
      lVar3 = 1;
    }
    else {
      pbVar2[1] = 0x7e;
      pbVar2[2] = bVar5;
      lVar10 = 4;
      lVar3 = 3;
    }
    pbVar2[lVar3] = bVar6;
    memcpy(pbVar2 + lVar10,data,len);
  }
  else {
    uVar1 = rand();
    if (first == '\0') {
      bVar11 = 0;
    }
    *pbVar2 = last << 7 | bVar11;
    if (len < 0x7e) {
      bVar6 = bVar6 | 0x80;
      lVar10 = 6;
      lVar9 = 5;
      lVar3 = 4;
      lVar4 = 3;
      lVar7 = 2;
      lVar8 = 1;
    }
    else {
      pbVar2[1] = 0xfe;
      pbVar2[2] = bVar5;
      lVar10 = 8;
      lVar9 = 7;
      lVar3 = 6;
      lVar4 = 5;
      lVar7 = 4;
      lVar8 = 3;
    }
    uVar1 = uVar1 | 0x1020408;
    pbVar2[lVar8] = bVar6;
    pbVar2[lVar7] = (byte)uVar1;
    pbVar2[lVar4] = (byte)(uVar1 >> 8);
    pbVar2[lVar3] = (byte)(uVar1 >> 0x10);
    pbVar2[lVar9] = (byte)(uVar1 >> 0x18);
    memcpy(pbVar2 + lVar10,data,len);
    websocket_xmask(pbVar2 + lVar10,len,uVar1);
  }
  options.after.dealloc = fio_free;
  options.data.buffer = pbVar2;
  options.length = lVar10 + len;
  options.offset = 0;
  options._32_8_ = (ulong)uStack_37 << 8;
  fio_write2_fn(fd,options);
  return;
}

Assistant:

static void websocket_write_impl(intptr_t fd, void *data, size_t len, char text,
                                 char first, char last, char client) {
  if (len <= WS_MAX_FRAME_SIZE) {
    void *buff = fio_malloc(len + 16);
    len = (client ? websocket_client_wrap(buff, data, len, (text ? 1 : 2),
                                          first, last, 0)
                  : websocket_server_wrap(buff, data, len, (text ? 1 : 2),
                                          first, last, 0));
    fio_write2(fd, .data.buffer = buff, .length = len,
               .after.dealloc = fio_free);
  } else {
    /* frame fragmentation is better for large data then large frames */
    while (len > WS_MAX_FRAME_SIZE) {
      websocket_write_impl(fd, data, WS_MAX_FRAME_SIZE, text, first, 0, client);
      data = ((uint8_t *)data) + WS_MAX_FRAME_SIZE;
      first = 0;
      len -= WS_MAX_FRAME_SIZE;
    }
    websocket_write_impl(fd, data, len, text, first, 1, client);
  }
  return;
}